

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCooperativeMatrixReduce
          (Builder *this,Op opcode,Id typeId,Id source,uint mask,Id func)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_38;
  Instruction *local_30;
  Instruction *op;
  uint local_20;
  Id func_local;
  uint mask_local;
  Id source_local;
  Id typeId_local;
  Op opcode_local;
  Builder *this_local;
  
  op._4_4_ = func;
  local_20 = mask;
  func_local = source;
  mask_local = typeId;
  source_local = opcode;
  _typeId_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,mask_local,source_local);
  local_30 = this_00;
  spv::Instruction::addIdOperand(this_00,func_local);
  spv::Instruction::addImmediateOperand(local_30,local_20);
  spv::Instruction::addIdOperand(local_30,op._4_4_);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_38,
             local_30);
  addInstruction(this,&local_38);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_38);
  IVar1 = spv::Instruction::getResultId(local_30);
  return IVar1;
}

Assistant:

Id Builder::createCooperativeMatrixReduce(Op opcode, Id typeId, Id source, unsigned int mask, Id func)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, opcode);
    op->addIdOperand(source);
    op->addImmediateOperand(mask);
    op->addIdOperand(func);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}